

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashFunc.cpp
# Opt level: O0

ULONG CaseSensitiveComputeHash(char *prgch,char *end)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ULONG local_1c;
  ULONG luHash;
  char *end_local;
  char *prgch_local;
  
  local_1c = 0;
  end_local = prgch;
  do {
    if (end <= end_local) {
      return local_1c;
    }
    bVar2 = utf8::IsStartByte(*end_local);
    if ((!bVar2) || (bVar2 = utf8::IsLeadByte(*end_local), bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/HashFunc.cpp"
                         ,0x30,"(utf8::IsStartByte(*prgch) && !utf8::IsLeadByte(*prgch))",
                         "utf8::IsStartByte(*prgch) && !utf8::IsLeadByte(*prgch)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_1c = local_1c * 0x11 + (int)*end_local;
    end_local = end_local + 1;
  } while( true );
}

Assistant:

ULONG CaseSensitiveComputeHash(char const * prgch, char const * end)
{
    ULONG luHash = 0;

    while (prgch < end)
    {
        Assert(utf8::IsStartByte(*prgch) && !utf8::IsLeadByte(*prgch));
        luHash = 17 * luHash + *prgch++;
    }
    return luHash;
}